

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O2

REF_STATUS
ref_recon_local_immediate_cloud
          (REF_CLOUD *one_layer,REF_NODE ref_node,REF_CELL ref_cell,REF_DBL *scalar)

{
  REF_ADJ pRVar1;
  REF_DBL *pRVar2;
  REF_ADJ_ITEM pRVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long global;
  ulong uVar8;
  long lVar9;
  REF_DBL xyzs [4];
  
  lVar7 = 0;
  do {
    if (ref_node->max <= lVar7) {
      return 0;
    }
    if ((-1 < ref_node->global[lVar7]) && (ref_node->ref_mpi->id == ref_node->part[lVar7])) {
      pRVar1 = ref_cell->ref_adj;
      uVar8 = 0xffffffff;
      iVar4 = -1;
      if (lVar7 < pRVar1->nnode) {
        uVar5 = pRVar1->first[lVar7];
        uVar8 = 0xffffffff;
        iVar4 = -1;
        if ((long)(int)uVar5 != -1) {
          iVar4 = pRVar1->item[(int)uVar5].ref;
          uVar8 = (ulong)uVar5;
        }
      }
      while ((int)uVar8 != -1) {
        lVar9 = 0;
        while ((int)lVar9 < ref_cell->node_per) {
          lVar6 = (long)ref_cell->c2n[(long)ref_cell->size_per * (long)iVar4 + lVar9];
          global = -1;
          if (((-1 < lVar6) &&
              (ref_cell->c2n[(long)ref_cell->size_per * (long)iVar4 + lVar9] < ref_node->max)) &&
             (global = ref_node->global[lVar6], global < 0)) {
            global = -1;
          }
          pRVar2 = ref_node->real;
          xyzs[0] = pRVar2[lVar6 * 0xf];
          xyzs[1] = pRVar2[lVar6 * 0xf + 1];
          xyzs[2] = pRVar2[lVar6 * 0xf + 2];
          xyzs[3] = scalar[lVar6];
          uVar5 = ref_cloud_store(one_layer[lVar7],global,xyzs);
          lVar9 = lVar9 + 1;
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x2e5,"ref_recon_local_immediate_cloud",(ulong)uVar5,"store could stencil");
            return uVar5;
          }
        }
        pRVar3 = ref_cell->ref_adj->item;
        uVar8 = (ulong)pRVar3[(int)uVar8].next;
        iVar4 = -1;
        if (uVar8 != 0xffffffffffffffff) {
          iVar4 = pRVar3[uVar8].ref;
        }
      }
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_recon_local_immediate_cloud(REF_CLOUD *one_layer,
                                                          REF_NODE ref_node,
                                                          REF_CELL ref_cell,
                                                          REF_DBL *scalar) {
  REF_INT node, item, cell, cell_node, target;
  REF_GLOB global;
  REF_DBL xyzs[4];
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      each_ref_cell_having_node(ref_cell, node, item, cell) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          target = ref_cell_c2n(ref_cell, cell_node, cell);
          global = ref_node_global(ref_node, target);
          xyzs[0] = ref_node_xyz(ref_node, 0, target);
          xyzs[1] = ref_node_xyz(ref_node, 1, target);
          xyzs[2] = ref_node_xyz(ref_node, 2, target);
          xyzs[3] = scalar[target];
          RSS(ref_cloud_store(one_layer[node], global, xyzs),
              "store could stencil");
        }
      }
    }
  }
  return REF_SUCCESS;
}